

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_4x4_sse4_1
               (int16_t *input,int32_t *coeff,int input_stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  int iVar2;
  int iVar3;
  undefined1 in_CL;
  int in_EDX;
  int32_t *in_RSI;
  int16_t *in_RDI;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i in [4];
  int in_stack_00000088;
  int in_stack_0000008c;
  __m128i *in_stack_00000090;
  __m128i *in_stack_00000098;
  int in_stack_000000e8;
  int in_stack_000000ec;
  __m128i *in_stack_000000f0;
  __m128i *in_stack_000000f8;
  longlong local_68 [10];
  undefined1 local_15;
  int local_14;
  int32_t *local_10;
  int16_t *local_8;
  
  piVar1 = av1_fwd_txfm_shift_ls[0];
  local_15 = in_CL;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = get_txw_idx('\0');
  iVar3 = get_txh_idx('\0');
  switch(local_15) {
  case 0:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 1:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 2:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 3:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 4:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,1,0,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 5:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,1,(int)*piVar1);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 6:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,1,1,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 7:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,1,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 8:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,1,0,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 9:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_col[iVar2][iVar3],1)
    ;
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 10:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 0xb:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fdct4x4_sse4_1(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 0xc:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 0xd:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,0,(int)*piVar1);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 0xe:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,1,0,(int)*piVar1);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    write_buffer_4x4((__m128i *)local_68,local_10);
    break;
  case 0xf:
    load_buffer_4x4(local_8,(__m128i *)local_68,local_14,0,1,(int)*piVar1);
    idtx4x4_sse4_1((__m128i *)local_68,(__m128i *)local_68,(int)av1_fwd_cos_bit_row[iVar2][iVar3],1)
    ;
    transpose_32bit_4x4((__m128i *)local_68,(__m128i *)local_68);
    fadst4x4_sse4_1(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
    write_buffer_4x4((__m128i *)local_68,local_10);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_4x4_sse4_1(const int16_t *input, int32_t *coeff,
                               int input_stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case IDTX:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}